

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddUtxoTemplateForFundRawTx
              (void *handle,void *fund_handle,char *txid,uint32_t vout,int64_t amount,
              char *descriptor,char *asset,char *scriptsig_template)

{
  bool bVar1;
  undefined8 uVar2;
  undefined4 in_ECX;
  char *in_RDX;
  long in_RSI;
  int64_t in_R8;
  char *in_R9;
  value_type *in_stack_00000008;
  char *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  UtxoData utxo;
  CfdCapiFundRawTxData *buffer;
  UtxoData *in_stack_fffffffffffff7b0;
  value_type *in_stack_fffffffffffff7b8;
  string *in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7c8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff7d0;
  CfdException *this;
  UtxoData *in_stack_fffffffffffff820;
  string local_789;
  undefined1 local_768 [32];
  string *in_stack_fffffffffffff8b8;
  undefined6 in_stack_fffffffffffff8c0;
  undefined1 in_stack_fffffffffffff8c6;
  exception in_stack_fffffffffffff8c7;
  string local_738 [32];
  CfdSourceLocation local_718;
  allocator local_6f9;
  string local_6f8;
  Script local_6d8;
  allocator local_699;
  string local_698 [32];
  Amount local_678;
  allocator local_661;
  string local_660;
  Txid local_640;
  undefined8 local_620;
  Txid local_5f8;
  undefined4 local_5d8;
  string local_3e0 [32];
  int64_t local_3c0;
  undefined1 local_3b8;
  undefined4 local_3b0;
  undefined8 local_3a8;
  ConfidentialAssetId local_3a0 [15];
  Script local_130;
  long local_f8;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  allocator local_69;
  string local_68 [48];
  char *local_38;
  int64_t local_30;
  undefined4 local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"FundRawTxData",&local_69);
  cfd::capi::CheckBuffer
            ((void *)CONCAT17(in_stack_fffffffffffff8c7,
                              CONCAT16(in_stack_fffffffffffff8c6,in_stack_fffffffffffff8c0)),
             in_stack_fffffffffffff8b8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0xc1e;
    local_88.funcname = "CfdAddUtxoTemplateForFundRawTx";
    cfd::core::logger::warn<>(&local_88,"txid is null or empty.");
    local_aa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to parameter. txid is null or empty.",&local_a9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff7d0,error_code,in_stack_fffffffffffff7c0);
    local_aa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_38);
  if (!bVar1) {
    local_f8 = local_18;
    cfd::UtxoData::UtxoData(in_stack_fffffffffffff820);
    local_3b0 = 1;
    local_620 = 0;
    local_3a8 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,local_20,&local_661);
    cfd::core::Txid::Txid(&local_640,&local_660);
    cfd::core::Txid::operator=(&local_5f8,&local_640);
    cfd::core::Txid::~Txid((Txid *)0x65bb96);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    local_5d8 = local_24;
    cfd::core::Amount::Amount(&local_678,local_30);
    local_3b8 = local_678.ignore_check_;
    local_3c0 = local_678.amount_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_698,local_38,&local_699);
    std::__cxx11::string::operator=(local_3e0,local_698);
    std::__cxx11::string::~string(local_698);
    std::allocator<char>::~allocator((allocator<char> *)&local_699);
    local_3b0 = 1;
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000010);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6f8,in_stack_00000010,&local_6f9);
      cfd::core::Script::Script(&local_6d8,&local_6f8);
      cfd::core::Script::operator=(&local_130,&local_6d8);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
    }
    if ((*(byte *)(local_f8 + 0x35) & 1) != 0) {
      bVar1 = cfd::capi::IsEmptyString((char *)in_stack_00000008);
      if (bVar1) {
        local_718.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        local_718.filename = local_718.filename + 1;
        local_718.line = 0xc3b;
        local_718.funcname = "CfdAddUtxoTemplateForFundRawTx";
        cfd::core::logger::warn<>(&local_718,"utxo asset is null or empty.");
        uVar2 = __cxa_allocate_exception(0x30);
        this = (CfdException *)&stack0xfffffffffffff8c7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_738,"Failed to parameter. utxo asset is null or empty.",(allocator *)this);
        cfd::core::CfdException::CfdException
                  (this,(CfdError)((ulong)uVar2 >> 0x20),in_stack_fffffffffffff7c0);
        __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      in_stack_fffffffffffff7c0 = &local_789;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_789.field_0x1,(char *)in_stack_00000008,
                 (allocator *)in_stack_fffffffffffff7c0);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_768,(string *)&local_789.field_0x1);
      cfd::core::ConfidentialAssetId::operator=(local_3a0,(ConfidentialAssetId *)local_768);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x65c003);
      std::__cxx11::string::~string((string *)&local_789.field_0x1);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      in_stack_fffffffffffff7b8 = in_stack_00000008;
    }
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff7c0,
               in_stack_fffffffffffff7b8);
    local_4 = 0;
    cfd::UtxoData::~UtxoData(in_stack_fffffffffffff7b0);
    return local_4;
  }
  local_c8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_c8.filename = local_c8.filename + 1;
  local_c8.line = 0xc24;
  local_c8.funcname = "CfdAddUtxoTemplateForFundRawTx";
  cfd::core::logger::warn<>(&local_c8,"descriptor is null or empty.");
  local_ea = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,"Failed to parameter. descriptor is null or empty.",&local_e9);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff7d0,error_code,in_stack_fffffffffffff7c0);
  local_ea = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddUtxoTemplateForFundRawTx(
    void* handle, void* fund_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* descriptor, const char* asset,
    const char* scriptsig_template) {
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(descriptor)) {
      warn(CFD_LOG_SOURCE, "descriptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null or empty.");
    }
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.txid = Txid(txid);
    utxo.vout = vout;
    utxo.amount = Amount(amount);
    utxo.descriptor = std::string(descriptor);
    utxo.address_type = AddressType::kP2shAddress;  // force init
    if (!IsEmptyString(scriptsig_template)) {
      utxo.scriptsig_template = Script(std::string(scriptsig_template));
    }
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      if (IsEmptyString(asset)) {
        warn(CFD_LOG_SOURCE, "utxo asset is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. utxo asset is null or empty.");
      }
      utxo.asset = ConfidentialAssetId(asset);
#endif  // CFD_DISABLE_ELEMENTS
    }
    buffer->utxos->push_back(utxo);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}